

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O3

ssize_t memory_write(archive *a,void *client_data,void *buff,size_t length)

{
  long lVar1;
  
  if (*(ulong *)((long)client_data + 8) < length + *client_data) {
    archive_set_error(a,0xc,"Buffer exhausted");
    length = 0xffffffffffffffe2;
  }
  else {
    memcpy((void *)(*client_data + *(long *)((long)client_data + 0x18)),buff,length);
    lVar1 = *client_data;
    *(size_t *)client_data = lVar1 + length;
    if (*(long **)((long)client_data + 0x10) != (long *)0x0) {
      **(long **)((long)client_data + 0x10) = lVar1 + length;
    }
  }
  return length;
}

Assistant:

static ssize_t
memory_write(struct archive *a, void *_private, const void *buff, size_t size)
{
	struct fileblocks *private = _private;
	struct fileblock *block;

	(void)a;

	if ((const char *)nulldata <= (const char *)buff
	    && (const char *)buff < (const char *)nulldata + nullsize) {
		/* We don't need to store a block of gap data. */
		private->last->gap_size += (int64_t)size;
	} else {
		/* Yes, we're assuming the very first write is metadata. */
		/* It's header or metadata, copy and save it. */
		block = malloc(sizeof(*block));
		memset(block, 0, sizeof(*block));
		block->size = (int)size;
		block->buff = malloc(size);
		memcpy(block->buff, buff, size);
		if (private->last == NULL) {
			private->first = private->last = block;
		} else {
			private->last->next = block;
			private->last = block;
		}
		block->next = NULL;
	}
	private->filesize += size;
	return ((long)size);
}